

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_data__latitude
          (ColladaParserAutoGen15Private *this,ParserChar *text,size_t textLength)

{
  void *pvVar1;
  size_t in_RDX;
  void *in_RSI;
  StackMemoryManager *in_RDI;
  ParserChar *tmp;
  
  if (in_RDI[9].mActiveFrame == 0) {
    pvVar1 = GeneratedSaxParser::StackMemoryManager::newObject(in_RDI,(size_t)in_RSI);
    in_RDI[9].mActiveFrame = (size_t)pvVar1;
    memcpy((void *)in_RDI[9].mActiveFrame,in_RSI,in_RDX);
    in_RDI[9].mFrames = (StackFrame *)(in_RDI[9].mActiveFrame + in_RDX);
  }
  else {
    pvVar1 = GeneratedSaxParser::StackMemoryManager::growObject
                       ((StackMemoryManager *)text,textLength);
    if (pvVar1 != (void *)in_RDI[9].mActiveFrame) {
      in_RDI[9].mFrames =
           (StackFrame *)(((long)in_RDI[9].mFrames - in_RDI[9].mActiveFrame) + (long)pvVar1);
      in_RDI[9].mActiveFrame = (size_t)pvVar1;
    }
    memcpy(in_RDI[9].mFrames,in_RSI,in_RDX);
    in_RDI[9].mFrames = (StackFrame *)((long)&(in_RDI[9].mFrames)->mCurrentPosition + in_RDX);
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_data__latitude( const ParserChar* text, size_t textLength )
{
if (!mLastIncompleteFragmentInCharacterData)
{
    mLastIncompleteFragmentInCharacterData = (ParserChar*)mStackMemoryManager.newObject(textLength);
    memcpy(mLastIncompleteFragmentInCharacterData, text, textLength);
    mEndOfDataInCurrentObjectOnStack = mLastIncompleteFragmentInCharacterData + textLength;
}
else
{
    ParserChar* tmp = (ParserChar*)mStackMemoryManager.growObject(textLength);
    if ( tmp != mLastIncompleteFragmentInCharacterData ) {
        mEndOfDataInCurrentObjectOnStack = (mEndOfDataInCurrentObjectOnStack - mLastIncompleteFragmentInCharacterData) + tmp;
        mLastIncompleteFragmentInCharacterData = tmp;
    }
    memcpy(mEndOfDataInCurrentObjectOnStack, text, textLength);
    mEndOfDataInCurrentObjectOnStack += textLength;
}
return true;
}